

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool check_dic_utf_8(char *path)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  char str [6];
  char file [260];
  byte local_12e;
  byte local_12d;
  byte local_12c;
  char local_12b;
  char local_12a;
  char local_128 [264];
  
  if ((path != (char *)0x0) && (*path != '\0')) {
    memset(local_128,0,0x104);
    u8tou8_path(path,local_128);
    sVar2 = strlen(local_128);
    if (sVar2 - 0xfc < 0xfffffffffffffefb) {
      return false;
    }
    strcat(local_128,G_SLASH_CHAR);
    sVar2 = strlen(local_128);
    builtin_strncpy(local_128 + sVar2,"unk.dic",8);
    __stream = fopen(local_128,"rb");
    if (__stream != (FILE *)0x0) {
      iVar1 = fseek(__stream,0x28,0);
      if (iVar1 == 0) {
        pcVar3 = fgets((char *)&local_12e,6,__stream);
        fclose(__stream);
        if (pcVar3 != (char *)0x0) {
          if (((((local_12e | 0x20) == 0x75) && ((local_12d | 0x20) == 0x74)) &&
              ((local_12c | 0x20) == 0x66)) &&
             (((local_12b == '_' || (local_12b == '-')) && (local_12a == '8')))) {
            return true;
          }
          if (g_verbose == true) {
            fprintf(_stderr,"this dic is not in utf-8: %s\n",path);
            return false;
          }
        }
      }
      else {
        fclose(__stream);
      }
    }
  }
  return false;
}

Assistant:

bool check_dic_utf_8(const char *path)
{
	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}
	char file[MAX_PATH];
	clear_path_string(file, MAX_PATH);
#if defined(_WIN32)
	u8tosjis_path(path, file);
#else
	u8tou8_path(path, file);
#endif
	if (7 + 1 + strlen(file) + 1 > MAX_PATH)
	{
		return false;
	}

	strcat(file, G_SLASH_CHAR);
	strcat(file, "unk.dic");

	FILE *fp = fopen(file, "rb");
	if (!fp)
	{
		return false;
	}
	if (fseek(fp, 0x28, SEEK_SET) != 0)
	{
		fclose(fp);
		return false;
	}
	char str[6];
	char *res = fgets(str, 6, fp);
	if( res == NULL )
	{
		fclose(fp);
		return false;
	}
	fclose(fp);
	char *p = str;
	if (*p != 'U' && *p != 'u')
		goto exit_false;
	p++;
	if (*p != 'T' && *p != 't')
		goto exit_false;
	p++;
	if (*p != 'F' && *p != 'f')
		goto exit_false;
	p++;
	if (*p != '-' && *p != '_')
		goto exit_false;
	p++;
	if (*p != '8')
		goto exit_false;
	return true;

exit_false:
	if (g_verbose)
	{
		console_message_string(u8"this dic is not in utf-8: %s\n", (char*)path);
	}
	return false;
}